

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O1

unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> __thiscall
rlottie::Animation::loadFromData
          (Animation *this,string *jsonData,string *resourcePath,ColorFilter *filter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_AnimationImpl_*,_false> this_01;
  shared_ptr<rlottie::internal::model::Composition> composition;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  string local_70;
  string local_50;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_50._M_string_length = jsonData->_M_string_length;
  if (local_50._M_string_length == 0) {
    (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
    super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
    super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl = (AnimationImpl *)0x0;
  }
  else {
    local_50._M_dataplus._M_p = (jsonData->_M_dataplus)._M_p;
    paVar1 = &jsonData->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar1) {
      local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&jsonData->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    (jsonData->_M_dataplus)._M_p = (pointer)paVar1;
    jsonData->_M_string_length = 0;
    (jsonData->field_2)._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (resourcePath->_M_dataplus)._M_p;
    paVar1 = &resourcePath->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar1) {
      local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&resourcePath->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_70._M_string_length = resourcePath->_M_string_length;
    (resourcePath->_M_dataplus)._M_p = (pointer)paVar1;
    resourcePath->_M_string_length = 0;
    (resourcePath->field_2)._M_local_buf[0] = '\0';
    local_88 = (_Manager_type)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = filter->_M_invoker;
    p_Var2 = (filter->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_98._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(filter->super__Function_base)._M_functor;
      local_98._8_8_ = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
      (filter->super__Function_base)._M_manager = (_Manager_type)0x0;
      filter->_M_invoker = (_Invoker_type)0x0;
      local_88 = p_Var2;
    }
    internal::model::loadFromData((model *)&local_a8,&local_50,&local_70,(ColorFilter *)&local_98);
    if (local_88 != (_Manager_type)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 == 0) {
      (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
      super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
      super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl = (AnimationImpl *)0x0;
    }
    else {
      this_01._M_head_impl = (AnimationImpl *)operator_new(8);
      Animation((Animation *)this_01._M_head_impl);
      this_00 = local_a0;
      (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
      super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
      super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl = this_01._M_head_impl;
      local_30 = local_a8;
      local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_28 = this_00;
      local_a8 = 0;
      AnimationImpl::init((AnimationImpl *)
                          *(unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_> *)
                           &(this_01._M_head_impl)->mLayerList,(EVP_PKEY_CTX *)&local_30);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return (__uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true>)
         (__uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Animation> Animation::loadFromData(std::string jsonData,
                                                   std::string resourcePath,
                                                   ColorFilter filter)
{
    if (jsonData.empty()) {
        vWarning << "jason data is empty";
        return nullptr;
    }

    auto composition = model::loadFromData(
        std::move(jsonData), std::move(resourcePath), std::move(filter));
    if (composition) {
        auto animation = std::unique_ptr<Animation>(new Animation);
        animation->d->init(std::move(composition));
        return animation;
    }
    return nullptr;
}